

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp_sint_t sexp_bignum_compare_abs(sexp a,sexp b)

{
  sexp_uint_t sVar1;
  sexp in_RSI;
  sexp in_RDI;
  sexp_uint_t *bdata;
  sexp_uint_t *adata;
  int bi;
  int ai;
  int local_1c;
  long local_8;
  
  sVar1 = sexp_bignum_hi(in_RDI);
  local_1c = (int)sVar1;
  sVar1 = sexp_bignum_hi(in_RSI);
  if (local_1c == (int)sVar1) {
    do {
      local_1c = local_1c + -1;
      if (local_1c < 0) {
        return 0;
      }
      if (*(ulong *)((long)&in_RSI->value + (long)local_1c * 8 + 0x10) <
          *(ulong *)((long)&in_RDI->value + (long)local_1c * 8 + 0x10)) {
        return 1;
      }
    } while (*(ulong *)((long)&in_RSI->value + (long)local_1c * 8 + 0x10) <=
             *(ulong *)((long)&in_RDI->value + (long)local_1c * 8 + 0x10));
    local_8 = -1;
  }
  else {
    local_8 = (long)(local_1c - (int)sVar1);
  }
  return local_8;
}

Assistant:

sexp_sint_t sexp_bignum_compare_abs (sexp a, sexp b) {
  int ai=sexp_bignum_hi(a), bi=sexp_bignum_hi(b);
  sexp_uint_t *adata=sexp_bignum_data(a), *bdata=sexp_bignum_data(b);
  if (ai != bi)
    return ai - bi;
  for (--ai; ai >= 0; ai--) {
    if (adata[ai] > bdata[ai])
      return 1;
    else if (adata[ai] < bdata[ai])
      return -1;
  }
  return 0;
}